

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

bool vkt::sr::anon_unknown_0::verifyConstantDerivate
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Vec4 *reference,Vec4 *threshold,Vec4 *scale,Vec4 *bias,
               VerificationLogging logPolicy)

{
  ostringstream *poVar1;
  ostream *stream;
  float fVar2;
  int i;
  DataType DVar3;
  long lVar4;
  uint uVar5;
  ConstPixelBufferAccess *pCVar7;
  int y;
  bool bVar8;
  float fVar9;
  BVec4 mask;
  Vector<bool,_4> res_8;
  Vec4 resDerivate;
  Vector<bool,_4> res_9;
  Vector<float,_4> res_7;
  int local_23c;
  undefined1 local_238 [24];
  Vector<float,_3> local_220;
  TestLog *local_210;
  TextureFormat local_208;
  undefined8 uStack_200;
  char local_1ec [4];
  ulong local_1e8 [3];
  ulong local_1d0;
  ConstPixelBufferAccess *local_1c8;
  PixelBufferAccess *local_1c0;
  undefined1 local_1b8 [392];
  ulong uVar6;
  
  local_210 = log;
  local_1c8 = result;
  local_1c0 = errorMask;
  DVar3 = glu::getDataTypeFloatScalars(dataType);
  switch(dataType) {
  case TYPE_FLOAT:
    local_1b8._0_4_ = 1;
    break;
  case TYPE_FLOAT_VEC2:
    local_1b8._0_4_ = 0x101;
    break;
  case TYPE_FLOAT_VEC3:
    local_1b8._0_4_ = 0x10101;
    break;
  default:
    local_1b8._0_4_ = 0x1010101;
  }
  local_238._20_4_ = 0;
  lVar4 = 0;
  do {
    local_238[lVar4 + 0x14] = local_1b8[lVar4] ^ 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (logPolicy == LOG_ALL) {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = local_210;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expecting ",10);
    if (DVar3 == TYPE_FLOAT_VEC3) {
      local_238._8_4_ = reference->m_data[2];
      local_238._0_4_ = reference->m_data[0];
      local_238._4_4_ = reference->m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)local_238);
    }
    else if (DVar3 == TYPE_FLOAT_VEC2) {
      local_238._0_4_ = reference->m_data[0];
      local_238._4_4_ = reference->m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_2> *)local_238);
    }
    else if (DVar3 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)reference->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,reference);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
    if (DVar3 == TYPE_FLOAT_VEC3) {
      local_238._8_4_ = threshold->m_data[2];
      local_238._0_4_ = threshold->m_data[0];
      local_238._4_4_ = threshold->m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)local_238);
    }
    else if (DVar3 == TYPE_FLOAT_VEC2) {
      local_238._0_4_ = threshold->m_data[0];
      local_238._4_4_ = threshold->m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_2> *)local_238);
    }
    else if (DVar3 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)threshold->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,threshold);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  }
  if ((local_1c8->m_size).m_data[1] < 1) {
    local_23c = 0;
  }
  else {
    uVar5 = 0;
    local_23c = 0;
    pCVar7 = local_1c8;
    local_238._16_4_ = DVar3;
    do {
      uVar6 = (ulong)uVar5;
      if (0 < (pCVar7->m_size).m_data[0]) {
        y = 0;
        local_1d0 = uVar6;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_238,(int)pCVar7,y,(int)uVar6);
          local_1b8._0_8_ = (TestLog *)0x0;
          local_1b8._8_8_ = 0;
          lVar4 = 0;
          do {
            *(float *)(local_1b8 + lVar4 * 4) =
                 *(float *)(local_238 + lVar4 * 4) - bias->m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_208.order = R;
          local_208.type = SNORM_INT8;
          uStack_200 = 0;
          lVar4 = 0;
          do {
            (&local_208.order)[lVar4] =
                 (ChannelOrder)(*(float *)(local_1b8 + lVar4 * 4) / scale->m_data[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_238._0_4_ = R;
          local_238._4_4_ = SNORM_INT8;
          local_238._8_4_ = 0;
          local_238._12_4_ = 0;
          lVar4 = 0;
          do {
            *(float *)(local_238 + lVar4 * 4) =
                 reference->m_data[lVar4] - (float)(&local_208.order)[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_1b8._0_8_ = (TestLog *)0x0;
          local_1b8._8_8_ = 0;
          lVar4 = 0;
          do {
            fVar2 = *(float *)(local_238 + lVar4 * 4);
            fVar9 = -fVar2;
            if (-fVar2 <= fVar2) {
              fVar9 = fVar2;
            }
            *(float *)(local_1b8 + lVar4 * 4) = fVar9;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_220.m_data._0_8_ = local_220.m_data._0_8_ & 0xffffffff00000000;
          lVar4 = 0;
          do {
            *(bool *)((long)local_220.m_data + lVar4) =
                 *(float *)(local_1b8 + lVar4 * 4) <= threshold->m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_1e8[0] = local_1e8[0] & 0xffffffff00000000;
          lVar4 = 0;
          do {
            *(byte *)((long)local_1e8 + lVar4) =
                 local_238[lVar4 + 0x14] | *(byte *)((long)local_220.m_data + lVar4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          builtin_strncpy(local_1ec,"\x01\x01\x01\x01",4);
          bVar8 = true;
          lVar4 = 0;
          do {
            if (bVar8) {
              bVar8 = *(char *)((long)local_1e8 + lVar4) == local_1ec[lVar4];
            }
            else {
              bVar8 = false;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          if (!bVar8) {
            if (local_23c < 10 && logPolicy == LOG_ALL) {
              local_1b8._0_8_ = local_210;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 8),"FAIL: got ",10);
              if (local_238._16_4_ == TYPE_FLOAT_VEC3) {
                local_238._8_4_ = (int)uStack_200;
                local_238._0_4_ = local_208.order;
                local_238._4_4_ = local_208.type;
                tcu::operator<<((ostream *)(local_1b8 + 8),(Vector<float,_3> *)local_238);
              }
              else if (local_238._16_4_ == TYPE_FLOAT_VEC2) {
                local_238._0_4_ = local_208.order;
                local_238._4_4_ = local_208.type;
                tcu::operator<<((ostream *)(local_1b8 + 8),(Vector<float,_2> *)local_238);
              }
              else if (local_238._16_4_ == TYPE_FLOAT) {
                std::ostream::_M_insert<double>((double)(float)local_208.order);
              }
              else {
                tcu::operator<<((ostream *)(local_1b8 + 8),(Vector<float,_4> *)&local_208);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 8),", diff = ",9);
              local_1e8[0] = 0;
              local_1e8[1] = 0;
              lVar4 = 0;
              do {
                *(float *)((long)local_1e8 + lVar4 * 4) =
                     reference->m_data[lVar4] - (float)(&local_208.order)[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
              local_238._0_4_ = R;
              local_238._4_4_ = SNORM_INT8;
              local_238._8_4_ = 0;
              local_238._12_4_ = 0;
              lVar4 = 0;
              stream = (ostream *)(local_1b8 + 8);
              do {
                fVar2 = *(float *)((long)local_1e8 + lVar4 * 4);
                fVar9 = -fVar2;
                if (-fVar2 <= fVar2) {
                  fVar9 = fVar2;
                }
                *(float *)(local_238 + lVar4 * 4) = fVar9;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
              if (local_238._16_4_ == TYPE_FLOAT_VEC3) {
                local_220.m_data[2] = (float)local_238._8_4_;
                local_220.m_data[0] = (float)local_238._0_4_;
                local_220.m_data[1] = (float)local_238._4_4_;
                tcu::operator<<(stream,&local_220);
              }
              else if (local_238._16_4_ == TYPE_FLOAT_VEC2) {
                local_220.m_data[0] = (float)local_238._0_4_;
                local_220.m_data[1] = (float)local_238._4_4_;
                tcu::operator<<(stream,(Vector<float,_2> *)&local_220);
              }
              else if (local_238._16_4_ == TYPE_FLOAT) {
                std::ostream::_M_insert<double>((double)(float)local_238._0_4_);
              }
              else {
                tcu::operator<<(stream,(Vector<float,_4> *)local_238);
              }
              std::__ostream_insert<char,std::char_traits<char>>(stream,", at x = ",9);
              std::ostream::operator<<(stream,y);
              std::__ostream_insert<char,std::char_traits<char>>(stream,", y = ",6);
              std::ostream::operator<<(stream,(int)local_1d0);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)stream);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
              uVar6 = local_1d0;
            }
            local_23c = local_23c + 1;
            local_238._0_4_ = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)local_1b8);
            tcu::PixelBufferAccess::setPixel(local_1c0,(Vec4 *)local_1b8,y,(int)uVar6,0);
          }
          uVar5 = (uint)uVar6;
          y = y + 1;
          pCVar7 = local_1c8;
        } while (y < (local_1c8->m_size).m_data[0]);
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < (pCVar7->m_size).m_data[1]);
  }
  if (logPolicy == LOG_ALL && 9 < local_23c) {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = local_210;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  }
  if (0 < local_23c && logPolicy == LOG_ALL) {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = local_210;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FAIL: found ",0xc);
    std::ostream::operator<<(poVar1,local_23c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," failed pixels",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  }
  return local_23c == 0;
}

Assistant:

static bool verifyConstantDerivate (tcu::TestLog&						log,
									const tcu::ConstPixelBufferAccess&	result,
									const tcu::PixelBufferAccess&		errorMask,
									glu::DataType						dataType,
									const tcu::Vec4&					reference,
									const tcu::Vec4&					threshold,
									const tcu::Vec4&					scale,
									const tcu::Vec4&					bias,
									VerificationLogging					logPolicy = LOG_ALL)
{
	const int			numComps		= glu::getDataTypeFloatScalars(dataType);
	const tcu::BVec4	mask			= tcu::logicalNot(getDerivateMask(dataType));
	int					numFailedPixels	= 0;

	if (logPolicy == LOG_ALL)
		log << TestLog::Message << "Expecting " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps) << TestLog::EndMessage;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4		resDerivate		= readDerivate(result, scale, bias, x, y);
			const bool			isOk			= tcu::allEqual(tcu::logicalOr(tcu::lessThanEqual(tcu::abs(reference - resDerivate), threshold), mask), tcu::BVec4(true));

			if (!isOk)
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
					log << TestLog::Message << "FAIL: got " << LogVecComps(resDerivate, numComps)
											<< ", diff = " << LogVecComps(tcu::abs(reference - resDerivate), numComps)
											<< ", at x = " << x << ", y = " << y
						<< TestLog::EndMessage;
				numFailedPixels += 1;
				errorMask.setPixel(tcu::RGBA::red().toVec(), x, y);
			}
		}
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0 && logPolicy == LOG_ALL)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}